

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int hd_anchor_hash(fy_accel *xl,void *key,void *userdata,void *hash)

{
  uint uVar1;
  size_t local_50;
  size_t len;
  char *text;
  uint *hashp;
  fy_token *fyt;
  void *hash_local;
  void *userdata_local;
  void *key_local;
  fy_accel *xl_local;
  
  text = (char *)hash;
  hashp = (uint *)key;
  fyt = (fy_token *)hash;
  hash_local = userdata;
  userdata_local = key;
  key_local = xl;
  len = (size_t)fy_token_get_text((fy_token *)key,&local_50);
  if ((char *)len == (char *)0x0) {
    xl_local._4_4_ = -1;
  }
  else {
    uVar1 = XXH32((void *)len,local_50,0x9e3779b1);
    *(uint *)text = uVar1;
    xl_local._4_4_ = 0;
  }
  return xl_local._4_4_;
}

Assistant:

static int hd_anchor_hash(struct fy_accel *xl, const void *key, void *userdata, void *hash) {
    struct fy_token *fyt = (void *) key;
    unsigned int *hashp = hash;
    const char *text;
    size_t len;

    text = fy_token_get_text(fyt, &len);
    if (!text)
        return -1;

    *hashp = XXH32(text, len, 2654435761U);
    return 0;
}